

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QDBusArgument qvariant_cast<QDBusArgument>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QMetaType QVar4;
  QDBusArgument *pQVar5;
  QMetaType QVar6;
  void *pvVar7;
  QDBusArgument *in_RSI;
  QDBusArgumentPrivate *in_RDI;
  long in_FS_OFFSET;
  QDBusArgument *t;
  QMetaType targetType;
  QMetaType *in_stack_ffffffffffffffa8;
  QDBusArgumentPrivate *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QVar4 = QMetaType::fromType<QDBusArgument>();
  QVariant::Private::type((Private *)this);
  bVar2 = operator==((QMetaType *)this,in_stack_ffffffffffffffa8);
  if (bVar2) {
    if (((ulong)in_RSI[3].d & 1) == 0) {
      QDBusArgument::QDBusArgument((QDBusArgument *)this,in_RSI);
    }
    else {
      iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x122e7b);
      if (iVar3 == 1) {
        pQVar5 = (QDBusArgument *)QVariant::PrivateShared::data((PrivateShared *)in_RSI->d);
        QDBusArgument::QDBusArgument((QDBusArgument *)this,pQVar5);
      }
      else {
        pQVar5 = QVariant::Private::get<QDBusArgument>((Private *)0x122ea9);
        QDBusArgument::QDBusArgument((QDBusArgument *)this,(QDBusArgument *)pQVar5);
      }
    }
  }
  else {
    *(undefined8 *)this = 0xaaaaaaaaaaaaaaaa;
    QDBusArgument::QDBusArgument((QDBusArgument *)this);
    QVar6.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    pvVar7 = QVariant::constData((QVariant *)0x122eea);
    QMetaType::convert(QVar6,pvVar7,QVar4,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDBusArgument)in_RDI;
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}